

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::vline_length(Fl_Text_Display *this,int visLineNum)

{
  int iVar1;
  int pos;
  int lineEndPos;
  int iVar2;
  Fl_Text_Buffer *this_00;
  int nextLineStartMinus1;
  int lineStartPos;
  int nextLineStart;
  int visLineNum_local;
  Fl_Text_Display *this_local;
  
  if ((visLineNum < 0) || (this->mNVisibleLines <= visLineNum)) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = this->mLineStarts[visLineNum];
    if (iVar1 == -1) {
      this_local._4_4_ = 0;
    }
    else if (visLineNum + 1 < this->mNVisibleLines) {
      pos = this->mLineStarts[visLineNum + 1];
      if (pos == -1) {
        this_local._4_4_ = this->mLastChar - iVar1;
      }
      else {
        this_00 = buffer(this);
        lineEndPos = Fl_Text_Buffer::prev_char(this_00,pos);
        iVar2 = wrap_uses_character(this,lineEndPos);
        if (iVar2 == 0) {
          this_local._4_4_ = pos - iVar1;
        }
        else {
          this_local._4_4_ = lineEndPos - iVar1;
        }
      }
    }
    else {
      this_local._4_4_ = this->mLastChar - iVar1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::vline_length( int visLineNum ) const {
  int nextLineStart, lineStartPos;

  if (visLineNum < 0 || visLineNum >= mNVisibleLines)
    return (0);

  lineStartPos = mLineStarts[ visLineNum ];

  if ( lineStartPos == -1 )
    return 0;

  if ( visLineNum + 1 >= mNVisibleLines )
    return mLastChar - lineStartPos;

  nextLineStart = mLineStarts[ visLineNum + 1 ];
  if ( nextLineStart == -1 )
    return mLastChar - lineStartPos;

  int nextLineStartMinus1 = buffer()->prev_char(nextLineStart);
  if (wrap_uses_character(nextLineStartMinus1))
    return nextLineStartMinus1 - lineStartPos;

  return nextLineStart - lineStartPos;
}